

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,FILE *fp)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  undefined8 in_RAX;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  size_t __n;
  Mat *pMVar7;
  int id;
  int len;
  undefined8 local_38;
  
  local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  clear(this);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  fread(&local_38,4,1,(FILE *)fp);
  while ((int)local_38 != -0xe9) {
    if ((int)local_38 < -0x5b03) {
      uVar6 = -(int)local_38 - 0x5b04;
      local_38 = (ulong)uVar6;
      fread((void *)((long)&local_38 + 4),4,1,(FILE *)fp);
      pMVar7 = &this->params[(int)uVar6].v;
      iVar3 = local_38._4_4_;
      __n = (size_t)(int)local_38._4_4_;
      if ((((this->params[(int)uVar6].v.dims != 1) ||
           (this->params[(int)uVar6].v.w != local_38._4_4_)) ||
          (this->params[(int)uVar6].v.elemsize != 4)) ||
         (this->params[(int)uVar6].v.allocator != (Allocator *)0x0)) {
        piVar1 = this->params[(int)uVar6].v.refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = this->params[(int)uVar6].v.allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (pMVar7->data != (void *)0x0) {
                free(*(void **)((long)pMVar7->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar2 + 8))();
            }
          }
        }
        pMVar7->data = (void *)0x0;
        this->params[(int)uVar6].v.refcount = (int *)0x0;
        this->params[(int)uVar6].v.elemsize = 0;
        this->params[(int)uVar6].v.cstep = 0;
        this->params[(int)uVar6].v.dims = 0;
        this->params[(int)uVar6].v.w = 0;
        this->params[(int)uVar6].v.h = 0;
        this->params[(int)uVar6].v.c = 0;
        this->params[(int)uVar6].v.elemsize = 4;
        this->params[(int)uVar6].v.allocator = (Allocator *)0x0;
        this->params[(int)uVar6].v.dims = 1;
        this->params[(int)uVar6].v.w = iVar3;
        this->params[(int)uVar6].v.h = 1;
        this->params[(int)uVar6].v.c = 1;
        this->params[(int)uVar6].v.cstep = __n;
        if (iVar3 != 0) {
          pvVar4 = malloc(__n * 4 + 0x1c);
          pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar4;
          pMVar7->data = pvVar5;
          piVar1 = (int *)((long)pvVar5 + __n * 4);
          this->params[(int)uVar6].v.refcount = piVar1;
          *piVar1 = 1;
        }
      }
      fread(pMVar7->data,4,__n,(FILE *)fp);
    }
    else {
      fread(&this->params[(int)local_38].field_1,4,1,(FILE *)fp);
    }
    this->params[(int)local_38].loaded = 1;
    fread(&local_38,4,1,(FILE *)fp);
  }
  return 0;
}

Assistant:

int ParamDict::load_param_bin(FILE* fp)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    fread(&id, sizeof(int), 1, fp);

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            fread(&len, sizeof(int), 1, fp);

            params[id].v.create(len);

            float* ptr = params[id].v;
            fread(ptr, sizeof(float), len, fp);
        }
        else
        {
            fread(&params[id].f, sizeof(float), 1, fp);
        }

        params[id].loaded = 1;

        fread(&id, sizeof(int), 1, fp);
    }

    return 0;
}